

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hak.cpp
# Opt level: O2

double __thiscall libDAI::HAK::doGBP(HAK *this)

{
  size_t sVar1;
  pointer pTVar2;
  long lVar3;
  long lVar4;
  _func_int *p_Var5;
  undefined1 auVar6 [16];
  bool bVar7;
  int iVar8;
  undefined4 extraout_var;
  ostream *poVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  size_type __n;
  undefined4 extraout_var_03;
  ulong uVar10;
  undefined4 extraout_var_04;
  undefined8 uVar11;
  undefined4 extraout_var_05;
  long lVar12;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  Factor *pFVar13;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  size_t *psVar14;
  ulong uVar15;
  size_t i;
  size_t *psVar16;
  double dVar17;
  Real x;
  undefined1 in_XMM2 [16];
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> old_beliefs;
  Factor Qb_new;
  Diffs diffs;
  Factor Qa_new;
  TFactor<double> local_d8;
  TFactor<double> local_a0;
  TFactor<double> local_68;
  
  iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])();
  if (CONCAT44(extraout_var,iVar8) != 0) {
    poVar9 = std::operator<<((ostream *)&std::cout,"Starting ");
    (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[9])(&diffs,this);
    poVar9 = std::operator<<(poVar9,(string *)&diffs);
    std::operator<<(poVar9,"...");
    std::__cxx11::string::~string((string *)&diffs);
  }
  iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])(this);
  if (2 < CONCAT44(extraout_var_00,iVar8)) {
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  uVar15 = 0xffffffffffffffff;
  toc();
  do {
    iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    uVar15 = uVar15 + 1;
  } while (uVar15 < (ulong)((*(long *)(CONCAT44(extraout_var_01,iVar8) + 0x100) -
                            *(long *)(CONCAT44(extraout_var_01,iVar8) + 0xf8)) / 0x28));
  old_beliefs.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  old_beliefs.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  old_beliefs.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  __n = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar8) + 0x28))
                  ((long *)CONCAT44(extraout_var_02,iVar8));
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
            (&old_beliefs,__n);
  uVar15 = 0;
  while( true ) {
    iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    uVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar8) + 0x28))
                       ((long *)CONCAT44(extraout_var_03,iVar8));
    if (uVar10 <= uVar15) break;
    iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    uVar11 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar8) + 0x30))
                       ((long *)CONCAT44(extraout_var_04,iVar8),uVar15);
    (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[10])
              (&diffs,this,uVar11);
    std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
    emplace_back<libDAI::TFactor<double>>
              ((vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)
               &old_beliefs,(TFactor<double> *)&diffs);
    TFactor<double>::~TFactor((TFactor<double> *)&diffs);
    uVar15 = uVar15 + 1;
  }
  iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  lVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar8) + 0x28))
                     ((long *)CONCAT44(extraout_var_05,iVar8));
  Diffs::Diffs(&diffs,lVar12,1.0);
  uVar15 = 0;
  do {
    this->_iterations = uVar15;
    if (((this->Props).maxiter <= uVar15) ||
       (dVar17 = Diffs::max(&diffs), dVar17 <= (this->Props).tol)) {
      dVar17 = Diffs::max(&diffs);
      if (this->_maxdiff < dVar17) {
        dVar17 = Diffs::max(&diffs);
        this->_maxdiff = dVar17;
      }
      iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])(this);
      if (CONCAT44(extraout_var_26,iVar8) != 0) {
        dVar17 = Diffs::max(&diffs);
        p_Var5 = (this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6];
        if (dVar17 <= (this->Props).tol) {
          iVar8 = (*p_Var5)(this);
          if (1 < CONCAT44(extraout_var_28,iVar8)) {
            std::operator<<((ostream *)&std::cout,"HAK::doGBP:  ");
          }
          poVar9 = std::operator<<((ostream *)&std::cout,"converged in ");
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          poVar9 = std::operator<<(poVar9," passes (");
          toc();
          poVar9 = std::ostream::_M_insert<long>((long)poVar9);
          poVar9 = std::operator<<(poVar9," clocks).");
        }
        else {
          iVar8 = (*p_Var5)(this);
          if (CONCAT44(extraout_var_27,iVar8) == 1) {
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          }
          poVar9 = std::operator<<((ostream *)&std::cout,
                                   "HAK::doGBP:  WARNING: not converged within ");
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          poVar9 = std::operator<<(poVar9," passes (");
          toc();
          poVar9 = std::ostream::_M_insert<long>((long)poVar9);
          std::operator<<(poVar9," clocks)...final maxdiff:");
          dVar17 = Diffs::max(&diffs);
          poVar9 = std::ostream::_M_insert<double>(dVar17);
        }
        std::endl<char,std::char_traits<char>>(poVar9);
      }
      dVar17 = Diffs::max(&diffs);
LAB_004e29c3:
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&diffs);
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::~vector
                (&old_beliefs);
      return dVar17;
    }
    uVar15 = 0;
    while( true ) {
      iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      if ((ulong)((*(long *)(CONCAT44(extraout_var_06,iVar8) + 0x100) -
                  *(long *)(CONCAT44(extraout_var_06,iVar8) + 0xf8)) / 0x28) <= uVar15) break;
      iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      lVar12 = uVar15 * 0x18;
      psVar14 = *(size_t **)(*(long *)(CONCAT44(extraout_var_07,iVar8) + 0x158) + lVar12);
      while( true ) {
        iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        if (psVar14 == *(size_t **)(*(long *)(CONCAT44(extraout_var_08,iVar8) + 0x158) + 8 + lVar12)
           ) break;
        sVar1 = *psVar14;
        pTVar2 = (this->_Qa).
                 super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        TFactor<double>::marginal
                  (&Qa_new,pTVar2 + sVar1,
                   (VarSet *)(uVar15 * 0x28 + *(long *)(CONCAT44(extraout_var_09,iVar8) + 0xf8)),
                   true);
        pFVar13 = muba(this,uVar15,*psVar14);
        TFactor<double>::divided_by(&Qb_new,&Qa_new,pFVar13);
        pFVar13 = muab(this,*psVar14,uVar15);
        TFactor<double>::operator=(pFVar13,&Qb_new);
        TFactor<double>::~TFactor(&Qb_new);
        TFactor<double>::~TFactor(&Qa_new);
        pFVar13 = muab(this,*psVar14,uVar15);
        iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        TProb<double>::normalize(&pFVar13->_p,*(NormType *)(CONCAT44(extraout_var_10,iVar8) + 8));
        psVar14 = psVar14 + 1;
      }
      TFactor<double>::TFactor(&Qb_new);
      iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      for (psVar14 = *(size_t **)(*(long *)(CONCAT44(extraout_var_11,iVar8) + 0x158) + lVar12);
          iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this),
          psVar14 != *(size_t **)(*(long *)(CONCAT44(extraout_var_12,iVar8) + 0x158) + 8 + lVar12);
          psVar14 = psVar14 + 1) {
        pFVar13 = muab(this,*psVar14,uVar15);
        iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        lVar3 = *(long *)(CONCAT44(extraout_var_13,iVar8) + 0x158);
        lVar4 = *(long *)(lVar3 + lVar12);
        lVar3 = *(long *)(lVar3 + 8 + lVar12);
        iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        auVar6 = vcvtusi2sd_avx512f(in_XMM2,lVar3 - lVar4 >> 3);
        TFactor<double>::operator^
                  (&Qa_new,pFVar13,
                   1.0 / (auVar6._0_8_ +
                         *(double *)
                          (*(long *)(CONCAT44(extraout_var_14,iVar8) + 0xf8) + 0x20 + uVar15 * 0x28)
                         ));
        TFactor<double>::operator*=(&Qb_new,&Qa_new);
        TFactor<double>::~TFactor(&Qa_new);
      }
      iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      TProb<double>::normalize(&Qb_new._p,*(NormType *)(CONCAT44(extraout_var_15,iVar8) + 8));
      bVar7 = TProb<double>::hasNaNs(&Qb_new._p);
      if (bVar7) {
        poVar9 = std::operator<<((ostream *)&std::cout,"HAK::doGBP:  Qb_new has NaNs!");
        std::endl<char,std::char_traits<char>>(poVar9);
LAB_004e29b1:
        TFactor<double>::~TFactor(&Qb_new);
        dVar17 = NAN;
        goto LAB_004e29c3;
      }
      if ((this->Props).doubleloop == false) {
        dVar17 = (this->Props).damping;
        if ((dVar17 == 0.0) && (!NAN(dVar17))) goto LAB_004e249d;
        TFactor<double>::operator^(&local_a0,&Qb_new,1.0 - dVar17);
        TFactor<double>::operator^
                  (&local_d8,
                   (this->_Qb).
                   super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar15,(this->Props).damping);
        TFactor<double>::operator*(&Qa_new,&local_a0,&local_d8);
        TFactor<double>::operator=
                  ((this->_Qb).
                   super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar15,&Qa_new);
        TFactor<double>::~TFactor(&Qa_new);
        TFactor<double>::~TFactor(&local_d8);
        TFactor<double>::~TFactor(&local_a0);
      }
      else {
LAB_004e249d:
        TFactor<double>::operator=
                  ((this->_Qb).
                   super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar15,&Qb_new);
      }
      iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      psVar14 = *(size_t **)(*(long *)(CONCAT44(extraout_var_16,iVar8) + 0x158) + lVar12);
      while (iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                               (this),
            psVar14 != *(size_t **)(*(long *)(CONCAT44(extraout_var_17,iVar8) + 0x158) + 8 + lVar12)
            ) {
        pTVar2 = (this->_Qb).
                 super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pFVar13 = muab(this,*psVar14,uVar15);
        TFactor<double>::divided_by(&Qa_new,pTVar2 + uVar15,pFVar13);
        pFVar13 = muba(this,uVar15,*psVar14);
        TFactor<double>::operator=(pFVar13,&Qa_new);
        TFactor<double>::~TFactor(&Qa_new);
        iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        TFactor<double>::TFactor
                  (&Qa_new,(TFactor<double> *)
                           (*psVar14 * 0x40 + *(long *)(CONCAT44(extraout_var_18,iVar8) + 0xe0)));
        iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        psVar16 = *(size_t **)(*(long *)(CONCAT44(extraout_var_19,iVar8) + 0x140) + *psVar14 * 0x18)
        ;
        while( true ) {
          iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this);
          if (psVar16 ==
              *(size_t **)(*(long *)(CONCAT44(extraout_var_20,iVar8) + 0x140) + 8 + *psVar14 * 0x18)
             ) break;
          pFVar13 = muba(this,*psVar16,*psVar14);
          TFactor<double>::operator*=(&Qa_new,pFVar13);
          psVar16 = psVar16 + 1;
        }
        iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        TProb<double>::operator^=
                  (&Qa_new._p,
                   1.0 / *(double *)
                          (*(long *)(CONCAT44(extraout_var_21,iVar8) + 0xe0) + 0x38 +
                          *psVar14 * 0x40));
        iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        TProb<double>::normalize(&Qa_new._p,*(NormType *)(CONCAT44(extraout_var_22,iVar8) + 8));
        bVar7 = TProb<double>::hasNaNs(&Qa_new._p);
        if (bVar7) {
          poVar9 = std::operator<<((ostream *)&std::cout,"HAK::doGBP:  Qa_new has NaNs!");
          std::endl<char,std::char_traits<char>>(poVar9);
        }
        else {
          if ((this->Props).doubleloop == false) {
            dVar17 = (this->Props).damping;
            if ((dVar17 != 0.0) || (NAN(dVar17))) {
              TFactor<double>::operator^(&local_d8,&Qa_new,1.0 - dVar17);
              TFactor<double>::operator^
                        (&local_68,
                         (this->_Qa).
                         super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + *psVar14,(this->Props).damping)
              ;
              TFactor<double>::operator*(&local_a0,&local_d8,&local_68);
              TFactor<double>::operator=
                        ((this->_Qa).
                         super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + *psVar14,&local_a0);
              TFactor<double>::~TFactor(&local_a0);
              TFactor<double>::~TFactor(&local_68);
              TFactor<double>::~TFactor(&local_d8);
              goto LAB_004e2674;
            }
          }
          TFactor<double>::operator=
                    ((this->_Qa).
                     super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + *psVar14,&Qa_new);
        }
LAB_004e2674:
        TFactor<double>::~TFactor(&Qa_new);
        psVar14 = psVar14 + 1;
        if (bVar7) goto LAB_004e29b1;
      }
      TFactor<double>::~TFactor(&Qb_new);
      uVar15 = uVar15 + 1;
    }
    lVar12 = 0;
    uVar15 = 0;
    while( true ) {
      iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      uVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_23,iVar8) + 0x28))
                         ((long *)CONCAT44(extraout_var_23,iVar8));
      if (uVar10 <= uVar15) break;
      iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      uVar11 = (**(code **)(*(long *)CONCAT44(extraout_var_24,iVar8) + 0x30))
                         ((long *)CONCAT44(extraout_var_24,iVar8),uVar15);
      (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[10])
                (&Qb_new,this,uVar11);
      x = dist(&Qb_new,(TFactor<double> *)
                       ((long)&((old_beliefs.
                                 super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                               super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl
                               .super__Vector_impl_data._M_start + lVar12),DISTLINF);
      Diffs::push(&diffs,x);
      TFactor<double>::operator=
                ((TFactor<double> *)
                 ((long)&((old_beliefs.
                           super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                         super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar12),&Qb_new);
      TFactor<double>::~TFactor(&Qb_new);
      uVar15 = uVar15 + 1;
      lVar12 = lVar12 + 0x38;
    }
    iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])(this);
    if (2 < CONCAT44(extraout_var_25,iVar8)) {
      std::operator<<((ostream *)&std::cout,"HAK::doGBP:  maxdiff ");
      dVar17 = Diffs::max(&diffs);
      poVar9 = std::ostream::_M_insert<double>(dVar17);
      poVar9 = std::operator<<(poVar9," after ");
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      poVar9 = std::operator<<(poVar9," passes");
      std::endl<char,std::char_traits<char>>(poVar9);
    }
    uVar15 = this->_iterations + 1;
  } while( true );
}

Assistant:

double HAK::doGBP() {
        if( Verbose() >= 1 )
            cout << "Starting " << identify() << "...";
        if( Verbose() >= 3)
            cout << endl;

// TODO: FIND OUT WHETHER IT WOULD BE USEFUL TO CATCH NANS BY TRAPPING FLOATING POINT EXCEPTIONS
//      feenableexcept(FE_DIVBYZERO | FE_INVALID | FE_OVERFLOW | FE_UNDERFLOW);

        clock_t tic = toc();

        // Check whether counting numbers won't lead to problems
        for( size_t beta = 0; beta < grm().nr_IRs(); beta++ )
            assert( grm().nbIR(beta).size() + grm().IR(beta).c() != 0.0 );

        // Keep old beliefs to check convergence
        vector<Factor> old_beliefs;
        old_beliefs.reserve( grm().nrVars() );
        for( size_t i = 0; i < grm().nrVars(); i++ )
            old_beliefs.push_back( belief( grm().var(i) ) );

        // Differences in single node beliefs
        Diffs diffs(grm().nrVars(), 1.0);

        // do several passes over the network until maximum number of iterations has
        // been reached or until the maximum belief difference is smaller than tolerance
        for( _iterations = 0; _iterations < Props.maxiter && diffs.max() > Props.tol; _iterations++ ) {
            for( size_t beta = 0; beta < grm().nr_IRs(); beta++ ) {
                for( RegionGraph::R_nb_cit alpha = grm().nbIR(beta).begin(); alpha != grm().nbIR(beta).end(); alpha++ ) {
                    muab(*alpha,beta) = _Qa[*alpha].marginal(grm().IR(beta)).divided_by( muba(beta,*alpha) );
                    /* TODO: INVESTIGATE THIS PROBLEM
                     *
                     * In some cases, the muab's can have very large entries because the muba's have very
                     * small entries. This may cause NANs later on (e.g., multiplying large quantities may
                     * result in +inf; normalization then tries to calculate inf / inf which is NAN). 
                     * A fix of this problem would consist in normalizing the messages muab.
                     * However, it is not obvious whether this is a real solution, because it has a
                     * negative performance impact and the NAN's seem to be a symptom of a fundamental
                     * numerical unstability.
                     */
                     muab(*alpha,beta).normalize( grm().normType() ); 
                }

                Factor Qb_new;
                for( RegionGraph::R_nb_cit alpha = grm().nbIR(beta).begin(); alpha != grm().nbIR(beta).end(); alpha++ )
                    Qb_new *= muab(*alpha,beta) ^ (1 / (grm().nbIR(beta).size() + grm().IR(beta).c()));
                Qb_new.normalize( grm().normType() );
                if( Qb_new.hasNaNs() ) {
                    // TODO: WHAT TO DO IN THIS CASE?
                    cout << "HAK::doGBP:  Qb_new has NaNs!" << endl;
                    return NAN;
                }
                /* TODO: WHAT IS THE PURPOSE OF THE FOLLOWING CODE?
                 *
                 *   _Qb[beta] = Qb_new.makeZero(1e-100);
                 */

                if( Props.doubleloop || Props.damping == 0.0 )
                    _Qb[beta] = Qb_new; // no damping for double loop
                else
                    _Qb[beta] = (Qb_new^(1.0 - Props.damping)) * (_Qb[beta]^Props.damping);

                for( RegionGraph::R_nb_cit alpha = grm().nbIR(beta).begin(); alpha != grm().nbIR(beta).end(); alpha++ ) {
                    muba(beta,*alpha) = _Qb[beta].divided_by( muab(*alpha,beta) );

                    /* TODO: INVESTIGATE WHETHER THIS HACK (INVENTED BY KEES) TO PREVENT NANS MAKES SENSE 
                     *
                     *   muba(beta,*alpha).makePositive(1e-100);
                     *
                     */

                    Factor Qa_new = grm().OR(*alpha);
                    for( RegionGraph::R_nb_cit gamma = grm().nbOR(*alpha).begin(); gamma != grm().nbOR(*alpha).end(); gamma++ )
                        Qa_new *= muba(*gamma,*alpha);
                    Qa_new ^= (1.0 / grm().OR(*alpha).c());
                    Qa_new.normalize( grm().normType() );
                    if( Qa_new.hasNaNs() ) {
                        cout << "HAK::doGBP:  Qa_new has NaNs!" << endl;
                        return NAN;
                    }
                    /* TODO: WHAT IS THE PURPOSE OF THE FOLLOWING CODE?
                     *
                     *   _Qb[beta] = Qb_new.makeZero(1e-100);
                     */

                if( Props.doubleloop || Props.damping == 0.0 )
                    _Qa[*alpha] = Qa_new; // no damping for double loop
                else
                    // FIXME: GEOMETRIC DAMPING IS SLOW!
                    _Qa[*alpha] = (Qa_new^(1.0 - Props.damping)) * (_Qa[*alpha]^Props.damping);
                }
            }

            // Calculate new single variable beliefs and compare with old ones
            for( size_t i = 0; i < grm().nrVars(); i++ ) {
                Factor new_belief = belief( grm().var( i ) );
                diffs.push( dist( new_belief, old_beliefs[i], Prob::DISTLINF ) );
                old_beliefs[i] = new_belief;
            }

            if( Verbose() >= 3 )
                cout << "HAK::doGBP:  maxdiff " << diffs.max() << " after " << _iterations+1 << " passes" << endl;
        }

        if( diffs.max() > _maxdiff )
            _maxdiff = diffs.max();

        if( Verbose() >= 1 ) {
            if( diffs.max() > Props.tol ) {
                if( Verbose() == 1 )
                    cout << endl;
                cout << "HAK::doGBP:  WARNING: not converged within " << Props.maxiter << " passes (" << toc() - tic << " clocks)...final maxdiff:" << diffs.max() << endl;
            } else {
                if( Verbose() >= 2 )
                    cout << "HAK::doGBP:  ";
                cout << "converged in " << _iterations << " passes (" << toc() - tic << " clocks)." << endl;
            }
        }

        return diffs.max();
    }